

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall
Memory::HeapInfo::EnumerateObjects
          (HeapInfo *this,ObjectInfoBits infoBits,_func_void_void_ptr_size_t *CallBackFunction)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  anon_class_16_2_d31750c2 fn;
  anon_class_16_2_d31750c2 fn_00;
  anon_class_16_2_d31750c2 fn_01;
  anon_class_16_2_d31750c2 fn_02;
  anon_class_16_2_d31750c2 fn_03;
  anon_class_16_2_d31750c2 fn_04;
  anon_class_16_2_d31750c2 fn_05;
  anon_class_16_2_d31750c2 fn_06;
  anon_class_16_2_d31750c2 fn_07;
  anon_class_16_2_d31750c2 fn_08;
  
  for (lVar1 = 0x78; lVar1 != 0xa878; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::EnumerateObjects
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),infoBits,CallBackFunction);
  }
  for (lVar1 = 0; uVar2 = CONCAT22(0,infoBits), lVar1 != 0x6580; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::EnumerateObjects
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar1),infoBits,CallBackFunction);
  }
  uVar3 = CONCAT22(0,infoBits);
  LargeHeapBucket::EnumerateObjects(&this->largeObjectBucket,infoBits,CallBackFunction);
  fn._4_4_ = 0;
  fn._0_4_ = uVar3;
  fn.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->newLeafHeapBlockList,fn);
  fn_00._4_4_ = 0;
  fn_00._0_4_ = uVar3;
  fn_00.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->newNormalHeapBlockList,fn_00);
  fn_01._4_4_ = 0;
  fn_01._0_4_ = uVar3;
  fn_01.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->newNormalWithBarrierHeapBlockList,fn_01);
  fn_02._4_4_ = 0;
  fn_02._0_4_ = uVar3;
  fn_02.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->newFinalizableWithBarrierHeapBlockList,fn_02);
  fn_03._4_4_ = 0;
  fn_03._0_4_ = uVar3;
  fn_03.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->newFinalizableHeapBlockList,fn_03);
  fn_04._4_4_ = 0;
  fn_04._0_4_ = uVar3;
  fn_04.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->newMediumLeafHeapBlockList,fn_04);
  fn_05._4_4_ = 0;
  fn_05._0_4_ = uVar3;
  fn_05.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->newMediumNormalHeapBlockList,fn_05);
  fn_06._4_4_ = 0;
  fn_06._0_4_ = uVar2;
  fn_06.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->newMediumNormalWithBarrierHeapBlockList,fn_06);
  fn_07._4_4_ = 0;
  fn_07._0_4_ = uVar2;
  fn_07.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->newMediumFinalizableWithBarrierHeapBlockList,fn_07);
  fn_08._4_4_ = 0;
  fn_08._0_4_ = uVar2;
  fn_08.CallBackFunction = CallBackFunction;
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucket::EnumerateObjects<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*,Memory::ObjectInfoBits,void(*)(void*,unsigned_long))::_lambda(Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->newMediumFinalizableHeapBlockList,fn_08);
  return;
}

Assistant:

void
HeapInfo::EnumerateObjects(ObjectInfoBits infoBits, void (*CallBackFunction)(void * address, size_t size))
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].EnumerateObjects(infoBits, CallBackFunction);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].EnumerateObjects(infoBits, CallBackFunction);
    }
#endif

    largeObjectBucket.EnumerateObjects(infoBits, CallBackFunction);

#if ENABLE_CONCURRENT_GC
    HeapBucket::EnumerateObjects(newLeafHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newNormalHeapBlockList, infoBits, CallBackFunction);
#ifdef RECYCLER_WRITE_BARRIER
    HeapBucket::EnumerateObjects(newNormalWithBarrierHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newFinalizableWithBarrierHeapBlockList, infoBits, CallBackFunction);
#endif

#ifdef RECYCLER_VISITED_HOST
    HeapBucket::EnumerateObjects(newRecyclerVisitedHostHeapBlockList, infoBits, CallBackFunction);
#endif
    HeapBucket::EnumerateObjects(newFinalizableHeapBlockList, infoBits, CallBackFunction);

    HeapBucket::EnumerateObjects(newMediumLeafHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newMediumNormalHeapBlockList, infoBits, CallBackFunction);
#ifdef RECYCLER_WRITE_BARRIER
    HeapBucket::EnumerateObjects(newMediumNormalWithBarrierHeapBlockList, infoBits, CallBackFunction);
    HeapBucket::EnumerateObjects(newMediumFinalizableWithBarrierHeapBlockList, infoBits, CallBackFunction);
#endif

#ifdef RECYCLER_VISITED_HOST
    HeapBucket::EnumerateObjects(newMediumRecyclerVisitedHostHeapBlockList, infoBits, CallBackFunction);
#endif
    HeapBucket::EnumerateObjects(newMediumFinalizableHeapBlockList, infoBits, CallBackFunction);
#endif
}